

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Own<capnp::ClientHook> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  size_t size;
  ClientHook *extraout_RDX;
  Own<capnp::ClientHook> OVar1;
  Array<capnp::PipelineOp> local_90;
  PipelineOp *local_78;
  PipelineOp *op;
  PipelineOp *__end2;
  PipelineOp *local_58;
  PipelineOp *__begin2;
  ArrayPtr<const_capnp::PipelineOp> *__range2;
  ArrayBuilder<capnp::PipelineOp> copy;
  QueuedPipeline *this_local;
  ArrayPtr<const_capnp::PipelineOp> ops_local;
  
  this_local = (QueuedPipeline *)ops.size_;
  copy.disposer = (ArrayDisposer *)ops.ptr;
  ops_local.size_ = (size_t)this;
  size = kj::ArrayPtr<const_capnp::PipelineOp>::size
                   ((ArrayPtr<const_capnp::PipelineOp> *)&this_local);
  kj::heapArrayBuilder<capnp::PipelineOp>((ArrayBuilder<capnp::PipelineOp> *)&__range2,size);
  __begin2 = (PipelineOp *)&this_local;
  local_58 = kj::ArrayPtr<const_capnp::PipelineOp>::begin
                       ((ArrayPtr<const_capnp::PipelineOp> *)&this_local);
  op = kj::ArrayPtr<const_capnp::PipelineOp>::end((ArrayPtr<const_capnp::PipelineOp> *)__begin2);
  for (; local_58 != op; local_58 = local_58 + 1) {
    local_78 = local_58;
    kj::ArrayBuilder<capnp::PipelineOp>::add<capnp::PipelineOp_const&>
              ((ArrayBuilder<capnp::PipelineOp> *)&__range2,local_58);
  }
  kj::ArrayBuilder<capnp::PipelineOp>::finish
            (&local_90,(ArrayBuilder<capnp::PipelineOp> *)&__range2);
  getPipelinedCap(this,(Array<capnp::PipelineOp> *)ops.ptr);
  kj::Array<capnp::PipelineOp>::~Array(&local_90);
  kj::ArrayBuilder<capnp::PipelineOp>::~ArrayBuilder((ArrayBuilder<capnp::PipelineOp> *)&__range2);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
    for (auto& op: ops) {
      copy.add(op);
    }
    return getPipelinedCap(copy.finish());
  }